

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O0

int __thiscall QPDFFormFieldObjectHelper::getFlags(QPDFFormFieldObjectHelper *this)

{
  bool bVar1;
  int local_74;
  allocator<char> local_41;
  string local_40 [32];
  QPDFObjectHandle f;
  QPDFFormFieldObjectHelper *this_local;
  
  f.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/Ff",&local_41);
  getInheritableFieldValue((QPDFFormFieldObjectHelper *)&stack0xffffffffffffffe0,(string *)this);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  if (bVar1) {
    local_74 = QPDFObjectHandle::getIntValueAsInt((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  }
  else {
    local_74 = 0;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffe0);
  return local_74;
}

Assistant:

int
QPDFFormFieldObjectHelper::getFlags()
{
    QPDFObjectHandle f = getInheritableFieldValue("/Ff");
    return f.isInteger() ? f.getIntValueAsInt() : 0;
}